

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O1

FileChecksum *
llbuild::basic::FileChecksum::getChecksumForPath(FileChecksum *__return_storage_ptr__,string *path)

{
  bool bVar1;
  uchar *in_RCX;
  size_t n;
  string *d;
  FileInfo fileInfo;
  PlatformSpecificHasher hasher;
  FileInfo local_128;
  FileChecksumHasher local_d8;
  MD5 local_c0;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  __return_storage_ptr__->bytes[0x10] = '\0';
  __return_storage_ptr__->bytes[0x11] = '\0';
  __return_storage_ptr__->bytes[0x12] = '\0';
  __return_storage_ptr__->bytes[0x13] = '\0';
  __return_storage_ptr__->bytes[0x14] = '\0';
  __return_storage_ptr__->bytes[0x15] = '\0';
  __return_storage_ptr__->bytes[0x16] = '\0';
  __return_storage_ptr__->bytes[0x17] = '\0';
  __return_storage_ptr__->bytes[0x18] = '\0';
  __return_storage_ptr__->bytes[0x19] = '\0';
  __return_storage_ptr__->bytes[0x1a] = '\0';
  __return_storage_ptr__->bytes[0x1b] = '\0';
  __return_storage_ptr__->bytes[0x1c] = '\0';
  __return_storage_ptr__->bytes[0x1d] = '\0';
  __return_storage_ptr__->bytes[0x1e] = '\0';
  __return_storage_ptr__->bytes[0x1f] = '\0';
  __return_storage_ptr__->bytes[0] = '\0';
  __return_storage_ptr__->bytes[1] = '\0';
  __return_storage_ptr__->bytes[2] = '\0';
  __return_storage_ptr__->bytes[3] = '\0';
  __return_storage_ptr__->bytes[4] = '\0';
  __return_storage_ptr__->bytes[5] = '\0';
  __return_storage_ptr__->bytes[6] = '\0';
  __return_storage_ptr__->bytes[7] = '\0';
  __return_storage_ptr__->bytes[8] = '\0';
  __return_storage_ptr__->bytes[9] = '\0';
  __return_storage_ptr__->bytes[10] = '\0';
  __return_storage_ptr__->bytes[0xb] = '\0';
  __return_storage_ptr__->bytes[0xc] = '\0';
  __return_storage_ptr__->bytes[0xd] = '\0';
  __return_storage_ptr__->bytes[0xe] = '\0';
  __return_storage_ptr__->bytes[0xf] = '\0';
  d = path;
  FileInfo::getInfoForPath(&local_128,path,false);
  if ((((local_128.device != 0) || (local_128.inode != 0)) || (local_128.mode != 0)) ||
     (((local_128.size != 0 || (local_128.modTime.seconds != 0)) ||
      (local_128.modTime.nanoseconds != 0)))) {
    if (((uint)local_128.mode >> 0xe & 1) != 0) {
      __return_storage_ptr__->bytes[0] = '\x01';
      return __return_storage_ptr__;
    }
    local_d8.file = (FILE *)0x0;
    local_d8._vptr_FileChecksumHasher = (_func_int **)&PTR_copy_00213680;
    local_d8.path = path;
    llvm::MD5::MD5(&local_c0,(uchar *)d,n,in_RCX);
    bVar1 = FileChecksumHasher::readAndDigest(&local_d8);
    if (bVar1) goto LAB_0016c80f;
  }
  local_28 = 0;
  uStack_24 = 0;
  uStack_20 = 0;
  uStack_1c = 0;
  __return_storage_ptr__->bytes[0x10] = '\0';
  __return_storage_ptr__->bytes[0x11] = '\0';
  __return_storage_ptr__->bytes[0x12] = '\0';
  __return_storage_ptr__->bytes[0x13] = '\0';
  __return_storage_ptr__->bytes[0x14] = '\0';
  __return_storage_ptr__->bytes[0x15] = '\0';
  __return_storage_ptr__->bytes[0x16] = '\0';
  __return_storage_ptr__->bytes[0x17] = '\0';
  __return_storage_ptr__->bytes[0x18] = '\0';
  __return_storage_ptr__->bytes[0x19] = '\0';
  __return_storage_ptr__->bytes[0x1a] = '\0';
  __return_storage_ptr__->bytes[0x1b] = '\0';
  __return_storage_ptr__->bytes[0x1c] = '\0';
  __return_storage_ptr__->bytes[0x1d] = '\0';
  __return_storage_ptr__->bytes[0x1e] = '\0';
  __return_storage_ptr__->bytes[0x1f] = '\0';
LAB_0016c80f:
  *(undefined4 *)__return_storage_ptr__->bytes = local_28;
  *(undefined4 *)(__return_storage_ptr__->bytes + 4) = uStack_24;
  *(undefined4 *)(__return_storage_ptr__->bytes + 8) = uStack_20;
  *(undefined4 *)(__return_storage_ptr__->bytes + 0xc) = uStack_1c;
  return __return_storage_ptr__;
}

Assistant:

FileChecksum FileChecksum::getChecksumForPath(const std::string& path) {
  FileChecksum result;

  FileInfo fileInfo = FileInfo::getInfoForPath(path);
  if (fileInfo.isMissing()) {
    memset(result.bytes, 0, sizeof(result.bytes));
  } else if (fileInfo.isDirectory()) {
    result.bytes[0] = 1;
  } else {
    PlatformSpecificHasher hasher(path);
    if (hasher.readAndDigest()) {
      hasher.copy(result.bytes);
    } else {
      memset(result.bytes, 0, sizeof(result.bytes));
    }
  }

  return result;
}